

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringCache.cpp
# Opt level: O3

JavascriptString * __thiscall Js::CharStringCache::GetStringForCharW(CharStringCache *this,char16 c)

{
  ScriptContext *scriptContext;
  Recycler *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  Recycler *alloc;
  BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar5;
  Type *addr;
  undefined **local_60;
  JavascriptString *str;
  size_t local_50;
  char *local_48;
  DWORD local_40;
  char16 local_32 [4];
  char16 c_local;
  
  local_32[0] = c;
  if ((ushort)c < 0x80) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CharStringCache.cpp"
                                ,0x36,"(!JavascriptString::IsASCII7BitChar(c))",
                                "!JavascriptString::IsASCII7BitChar(c)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  scriptContext = (ScriptContext *)this[-5].charStringCacheA[0x73].ptr;
  iVar3 = (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(scriptContext);
  if ((char)iVar3 == '\0') {
    pBVar5 = (this->charStringCache).ptr;
    addr = &this->charStringCache;
    if (pBVar5 == (BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *)0x0) {
      this_00 = scriptContext->recycler;
      local_60 = &JsUtil::
                  BaseDictionary<char16_t,Js::JavascriptString*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      str = (JavascriptString *)0x0;
      local_50 = 0xffffffffffffffff;
      local_48 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CharStringCache.cpp"
      ;
      local_40 = 0x3e;
      alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)&stack0xffffffffffffffa0);
      pBVar5 = (BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)new<Memory::Recycler>(0x38,alloc,0x387914);
      (pBVar5->buckets).ptr = (int *)0x0;
      (pBVar5->entries).ptr =
           (SimpleDictionaryEntry<char16_t,_Memory::WriteBarrierPtr<Js::JavascriptString>_> *)0x0;
      pBVar5->alloc = this_00;
      pBVar5->size = 0;
      pBVar5->bucketCount = 0;
      pBVar5->count = 0;
      pBVar5->freeCount = 0;
      pBVar5->modFunctionIndex = 0x4b;
      pBVar5->stats = (Type)0x0;
      JsUtil::
      BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Initialize(pBVar5,0x11);
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = pBVar5;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      pBVar5 = addr->ptr;
    }
    bVar2 = JsUtil::
            BaseDictionary<char16_t,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<char16_t>(pBVar5,local_32,(JavascriptString **)&stack0xffffffffffffffa0);
    if (!bVar2) {
      local_60 = (undefined **)SingleCharString::New(local_32[0],scriptContext);
      JsUtil::
      BaseDictionary<char16_t,Js::JavascriptString*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<char16_t,Js::JavascriptString*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<char16_t,Js::JavascriptString*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)addr->ptr,local_32,(JavascriptString **)&stack0xffffffffffffffa0);
    }
  }
  else {
    local_60 = (undefined **)SingleCharString::New(c,scriptContext);
  }
  return (JavascriptString *)local_60;
}

Assistant:

JavascriptString* CharStringCache::GetStringForCharW(char16 c)
    {
        Assert(!JavascriptString::IsASCII7BitChar(c));
        JavascriptString* str;
        ScriptContext * scriptContext = JavascriptLibrary::FromCharStringCache(this)->GetScriptContext();
        if (!scriptContext->IsClosed())
        {
            if (charStringCache == nullptr)
            {
                Recycler * recycler = scriptContext->GetRecycler();
                charStringCache = RecyclerNew(recycler, CharStringCacheMap, recycler, 17);
            }
            if (!charStringCache->TryGetValue(c, &str))
            {
                str = SingleCharString::New(c, scriptContext);
                charStringCache->Add(c, str);
            }
        }
        else
        {
            str = SingleCharString::New(c, scriptContext);
        }
        return str;
    }